

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

void embree::instanceBoundsFunc(RTCBoundsFunctionArguments *args)

{
  long lVar1;
  undefined4 *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  long *in_RDI;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  Vec3fa lower;
  Vec3fa p111;
  Vec3fa p110;
  Vec3fa p101;
  Vec3fa p100;
  Vec3fa p011;
  Vec3fa p010;
  Vec3fa p001;
  Vec3fa p000;
  Vec3fa u;
  Vec3fa l;
  RTCBounds *bounds_o;
  Instance *instance;
  undefined4 local_26f8;
  undefined4 uStack_26f4;
  undefined4 uStack_26f0;
  undefined4 local_2688;
  undefined4 uStack_2684;
  undefined4 uStack_2680;
  float local_2618;
  float local_2598;
  undefined8 local_24e8;
  undefined8 uStack_24e0;
  undefined8 local_2478;
  undefined8 uStack_2470;
  undefined8 local_2408;
  undefined8 uStack_2400;
  undefined8 local_2398;
  undefined8 uStack_2390;
  undefined8 local_2328;
  undefined8 uStack_2320;
  undefined8 local_22b8;
  undefined8 uStack_22b0;
  undefined8 local_2248;
  undefined8 uStack_2240;
  undefined8 local_21d8;
  undefined8 uStack_21d0;
  float local_1618;
  float fStack_1614;
  float fStack_1610;
  float fStack_160c;
  float local_15b8;
  float fStack_15b4;
  float fStack_15b0;
  float fStack_15ac;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_da8;
  float fStack_da4;
  float fStack_da0;
  float fStack_d9c;
  float local_d48;
  float fStack_d44;
  float fStack_d40;
  float fStack_d3c;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7a8;
  float fStack_7a4;
  float fStack_7a0;
  float fStack_79c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  Vec3fa upper;
  
  lVar1 = *in_RDI;
  puVar2 = (undefined4 *)in_RDI[2];
  local_2598 = (float)*(undefined8 *)(lVar1 + 0xd0);
  local_15b8 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_15b4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_15b0 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_15ac = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_1618 = (float)local_21d8;
  fStack_1614 = (float)((ulong)local_21d8 >> 0x20);
  fStack_1610 = (float)uStack_21d0;
  fStack_160c = (float)((ulong)uStack_21d0 >> 0x20);
  uVar3 = CONCAT44(local_2598 * fStack_15b4 + fStack_1614,local_2598 * local_15b8 + local_1618);
  uVar4 = CONCAT44(local_2598 * fStack_15ac + fStack_160c,local_2598 * fStack_15b0 + fStack_1610);
  local_12e8 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_12e4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_12e0 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_12dc = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_1348 = (float)local_2248;
  fStack_1344 = (float)((ulong)local_2248 >> 0x20);
  fStack_1340 = (float)uStack_2240;
  fStack_133c = (float)((ulong)uStack_2240 >> 0x20);
  uVar5 = CONCAT44(local_2598 * fStack_12e4 + fStack_1344,local_2598 * local_12e8 + local_1348);
  uVar6 = CONCAT44(local_2598 * fStack_12dc + fStack_133c,local_2598 * fStack_12e0 + fStack_1340);
  local_1018 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_1014 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_1010 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_100c = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_1078 = (float)local_22b8;
  fStack_1074 = (float)((ulong)local_22b8 >> 0x20);
  fStack_1070 = (float)uStack_22b0;
  fStack_106c = (float)((ulong)uStack_22b0 >> 0x20);
  uVar7 = CONCAT44(local_2598 * fStack_1014 + fStack_1074,local_2598 * local_1018 + local_1078);
  uVar8 = CONCAT44(local_2598 * fStack_100c + fStack_106c,local_2598 * fStack_1010 + fStack_1070);
  local_d48 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_d44 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_d40 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_d3c = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_da8 = (float)local_2328;
  fStack_da4 = (float)((ulong)local_2328 >> 0x20);
  fStack_da0 = (float)uStack_2320;
  fStack_d9c = (float)((ulong)uStack_2320 >> 0x20);
  uVar9 = CONCAT44(local_2598 * fStack_d44 + fStack_da4,local_2598 * local_d48 + local_da8);
  uVar10 = CONCAT44(local_2598 * fStack_d3c + fStack_d9c,local_2598 * fStack_d40 + fStack_da0);
  local_2618 = (float)*(undefined8 *)(lVar1 + 0xe0);
  local_a78 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_a74 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_a70 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_a6c = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_ad8 = (float)local_2398;
  fStack_ad4 = (float)((ulong)local_2398 >> 0x20);
  fStack_ad0 = (float)uStack_2390;
  fStack_acc = (float)((ulong)uStack_2390 >> 0x20);
  uVar11 = CONCAT44(local_2618 * fStack_a74 + fStack_ad4,local_2618 * local_a78 + local_ad8);
  uVar12 = CONCAT44(local_2618 * fStack_a6c + fStack_acc,local_2618 * fStack_a70 + fStack_ad0);
  local_7a8 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_7a4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_7a0 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_79c = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_808 = (float)local_2408;
  fStack_804 = (float)((ulong)local_2408 >> 0x20);
  fStack_800 = (float)uStack_2400;
  fStack_7fc = (float)((ulong)uStack_2400 >> 0x20);
  uVar13 = CONCAT44(local_2618 * fStack_7a4 + fStack_804,local_2618 * local_7a8 + local_808);
  uVar14 = CONCAT44(local_2618 * fStack_79c + fStack_7fc,local_2618 * fStack_7a0 + fStack_800);
  local_4d8 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_4d4 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_4d0 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_4cc = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_538 = (float)local_2478;
  fStack_534 = (float)((ulong)local_2478 >> 0x20);
  fStack_530 = (float)uStack_2470;
  fStack_52c = (float)((ulong)uStack_2470 >> 0x20);
  uVar15 = CONCAT44(local_2618 * fStack_4d4 + fStack_534,local_2618 * local_4d8 + local_538);
  uVar16 = CONCAT44(local_2618 * fStack_4cc + fStack_52c,local_2618 * fStack_4d0 + fStack_530);
  local_208 = (float)*(undefined8 *)(lVar1 + 0x20);
  fStack_204 = (float)((ulong)*(undefined8 *)(lVar1 + 0x20) >> 0x20);
  fStack_200 = (float)*(undefined8 *)(lVar1 + 0x28);
  fStack_1fc = (float)((ulong)*(undefined8 *)(lVar1 + 0x28) >> 0x20);
  local_268 = (float)local_24e8;
  fStack_264 = (float)((ulong)local_24e8 >> 0x20);
  fStack_260 = (float)uStack_24e0;
  fStack_25c = (float)((ulong)uStack_24e0 >> 0x20);
  uVar17 = CONCAT44(local_2618 * fStack_204 + fStack_264,local_2618 * local_208 + local_268);
  uVar18 = CONCAT44(local_2618 * fStack_1fc + fStack_25c,local_2618 * fStack_200 + fStack_260);
  auVar29._8_8_ = uVar4;
  auVar29._0_8_ = uVar3;
  auVar27._8_8_ = uVar6;
  auVar27._0_8_ = uVar5;
  auVar31 = minps(auVar29,auVar27);
  auVar25._8_8_ = uVar8;
  auVar25._0_8_ = uVar7;
  auVar23._8_8_ = uVar10;
  auVar23._0_8_ = uVar9;
  auVar32 = minps(auVar25,auVar23);
  auVar32 = minps(auVar31,auVar32);
  auVar21._8_8_ = uVar12;
  auVar21._0_8_ = uVar11;
  auVar19._8_8_ = uVar14;
  auVar19._0_8_ = uVar13;
  auVar33 = minps(auVar21,auVar19);
  auVar34._8_8_ = uVar16;
  auVar34._0_8_ = uVar15;
  auVar31._8_8_ = uVar18;
  auVar31._0_8_ = uVar17;
  auVar31 = minps(auVar34,auVar31);
  auVar31 = minps(auVar33,auVar31);
  auVar31 = minps(auVar32,auVar31);
  uStack_2684 = auVar31._4_4_;
  local_2688 = auVar31._0_4_;
  uStack_2680 = auVar31._8_4_;
  auVar30._8_8_ = uVar4;
  auVar30._0_8_ = uVar3;
  auVar28._8_8_ = uVar6;
  auVar28._0_8_ = uVar5;
  auVar31 = maxps(auVar30,auVar28);
  auVar26._8_8_ = uVar8;
  auVar26._0_8_ = uVar7;
  auVar24._8_8_ = uVar10;
  auVar24._0_8_ = uVar9;
  auVar32 = maxps(auVar26,auVar24);
  auVar31 = maxps(auVar31,auVar32);
  auVar22._8_8_ = uVar12;
  auVar22._0_8_ = uVar11;
  auVar20._8_8_ = uVar14;
  auVar20._0_8_ = uVar13;
  auVar34 = maxps(auVar22,auVar20);
  auVar33._8_8_ = uVar16;
  auVar33._0_8_ = uVar15;
  auVar32._8_8_ = uVar18;
  auVar32._0_8_ = uVar17;
  auVar32 = maxps(auVar33,auVar32);
  auVar32 = maxps(auVar34,auVar32);
  auVar31 = maxps(auVar31,auVar32);
  uStack_26f4 = auVar31._4_4_;
  local_26f8 = auVar31._0_4_;
  uStack_26f0 = auVar31._8_4_;
  *puVar2 = local_2688;
  puVar2[1] = uStack_2684;
  puVar2[2] = uStack_2680;
  puVar2[4] = local_26f8;
  puVar2[5] = uStack_26f4;
  puVar2[6] = uStack_26f0;
  return;
}

Assistant:

void instanceBoundsFunc(const struct RTCBoundsFunctionArguments* args)
{
  const Instance* instance = (const Instance*) args->geometryUserPtr;
  RTCBounds* bounds_o = args->bounds_o;
  Vec3fa l = instance->lower;
  Vec3fa u = instance->upper;
  Vec3fa p000 = xfmPoint(instance->local2world,Vec3fa(l.x,l.y,l.z));
  Vec3fa p001 = xfmPoint(instance->local2world,Vec3fa(l.x,l.y,u.z));
  Vec3fa p010 = xfmPoint(instance->local2world,Vec3fa(l.x,u.y,l.z));
  Vec3fa p011 = xfmPoint(instance->local2world,Vec3fa(l.x,u.y,u.z));
  Vec3fa p100 = xfmPoint(instance->local2world,Vec3fa(u.x,l.y,l.z));
  Vec3fa p101 = xfmPoint(instance->local2world,Vec3fa(u.x,l.y,u.z));
  Vec3fa p110 = xfmPoint(instance->local2world,Vec3fa(u.x,u.y,l.z));
  Vec3fa p111 = xfmPoint(instance->local2world,Vec3fa(u.x,u.y,u.z));
  Vec3fa lower = min(min(min(p000,p001),min(p010,p011)),min(min(p100,p101),min(p110,p111)));
  Vec3fa upper = max(max(max(p000,p001),max(p010,p011)),max(max(p100,p101),max(p110,p111)));
  bounds_o->lower_x = lower.x;
  bounds_o->lower_y = lower.y;
  bounds_o->lower_z = lower.z;
  bounds_o->upper_x = upper.x;
  bounds_o->upper_y = upper.y;
  bounds_o->upper_z = upper.z;
}